

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O0

void __thiscall NaNNUnit::FeedbackValues(NaNNUnit *this,NaReal *fb)

{
  int iVar1;
  int iVar2;
  undefined4 *puVar3;
  NaReal *pNVar4;
  long in_RSI;
  long *in_RDI;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  if (in_RSI != 0) {
    iVar1 = (**(code **)(*in_RDI + 0x58))();
    if (iVar1 != 0) {
      pNVar4 = NaVector::operator[]
                         ((NaVector *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
      iVar1 = (**(code **)(*in_RDI + 0x50))();
      iVar2 = (**(code **)(*in_RDI + 0x58))();
      (**(code **)(*in_RDI + 0xb0))
                (in_RDI,in_RDI + 0xac,in_RDI + 0xb2,in_RSI,pNVar4,iVar1 * iVar2,0);
    }
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void
NaNNUnit::FeedbackValues (NaReal* fb)
{
    if(NULL == fb)
        throw(na_null_pointer);

    if(0 == FeedbackDepth())
        // No need for feedback values
        return;

#if 0
    unsigned    i, j;

    for(i = 0; i < FeedbackDepth(); ++i)
        for(j = 0; j < OutputDim(); ++j)
            feedback[i * OutputDim() + j] = fb[i * OutputDim() + j];
#endif

    // Scale output vector
    ScaleData(OutputScaler, StdInputRange, fb, &feedback[0],
              OutputDim() * FeedbackDepth());
}